

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall xemmai::t_parser::operator()(t_parser *this,t_scope *a_scope)

{
  t_scope *ptVar1;
  size_t sVar2;
  bool bVar3;
  t_token tVar4;
  pointer pwVar5;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *this_00;
  reference pptVar6;
  pointer ppVar7;
  reference pptVar8;
  size_type sVar9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> bVar10;
  t_variable *local_c0;
  t_variable *p;
  iterator __end1_1;
  iterator __begin1_1;
  vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *__range1_1;
  vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> variables;
  _Self local_80;
  iterator i;
  t_object *symbol;
  iterator __end1;
  iterator __begin1;
  set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
  *__range1;
  undefined1 local_28 [16];
  size_t indent;
  t_scope *a_scope_local;
  t_parser *this_local;
  
  this->v_scope = a_scope;
  indent = (size_t)a_scope;
  a_scope_local = (t_scope *)this;
  local_28._8_8_ = t_lexer::f_indent(&this->v_lexer);
  while( true ) {
    tVar4 = t_lexer::f_token(&this->v_lexer);
    if (tVar4 == c_token__EOF) {
      this_00 = &this->v_scope->v_unresolveds;
      __end1 = std::
               set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
               ::begin(this_00);
      symbol = (t_object *)
               std::
               set<xemmai::t_object_*,_std::less<xemmai::t_object_*>,_std::allocator<xemmai::t_object_*>_>
               ::end(this_00);
      while (bVar3 = std::operator==(&__end1,(_Self *)&symbol), ((bVar3 ^ 0xffU) & 1) != 0) {
        pptVar6 = std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator*(&__end1);
        i._M_node = (_Base_ptr)*pptVar6;
        local_80._M_node =
             (_Base_ptr)
             std::
             map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
             ::find(&this->v_scope->v_variables,(key_type *)&i);
        variables.
        super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::
                      map<xemmai::t_object_*,_xemmai::t_code::t_variable,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>_>
                      ::end(&this->v_scope->v_variables);
        bVar3 = std::operator==(&local_80,
                                (_Self *)&variables.
                                          super__Vector_base<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          ppVar7 = std::
                   _Rb_tree_iterator<std::pair<xemmai::t_object_*const,_xemmai::t_code::t_variable>_>
                   ::operator->(&local_80);
          (ppVar7->second).v_shared = true;
        }
        std::_Rb_tree_const_iterator<xemmai::t_object_*>::operator++(&__end1);
      }
      std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
      vector((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *)
             &__range1_1);
      std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::swap
                ((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                  *)&__range1_1,&this->v_scope->v_privates);
      if ((this->v_scope->v_self_shared & 1U) != 0) {
        this->v_scope->v_shareds = this->v_scope->v_shareds + 1;
      }
      __end1_1 = std::
                 vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                 ::begin((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                          *)&__range1_1);
      p = (t_variable *)
          std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          end((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *
              )&__range1_1);
      while (bVar3 = __gnu_cxx::
                     operator==<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                               (&__end1_1,
                                (__normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                                 *)&p), ((bVar3 ^ 0xffU) & 1) != 0) {
        pptVar8 = __gnu_cxx::
                  __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
                  ::operator*(&__end1_1);
        local_c0 = *pptVar8;
        if ((local_c0->v_shared & 1U) == 0) {
          sVar9 = std::
                  vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                  ::size(&this->v_scope->v_privates);
          local_c0->v_index = sVar9;
          std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          push_back(&this->v_scope->v_privates,&local_c0);
        }
        else {
          sVar2 = this->v_scope->v_shareds;
          this->v_scope->v_shareds = sVar2 + 1;
          local_c0->v_index = sVar2;
        }
        __gnu_cxx::
        __normal_iterator<xemmai::t_code::t_variable_**,_std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>_>
        ::operator++(&__end1_1);
      }
      std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
      ~vector((vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_> *
              )&__range1_1);
      return;
    }
    ptVar1 = this->v_scope;
    f_expression((t_parser *)local_28);
    std::
    vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
    ::push_back(&ptVar1->v_block,(value_type *)local_28);
    std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::~unique_ptr
              ((unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)
               local_28);
    bVar3 = t_lexer::f_newline(&this->v_lexer);
    if (!bVar3) break;
    pwVar5 = (pointer)t_lexer::f_indent(&this->v_lexer);
    if (pwVar5 != (pointer)local_28._8_8_) {
      bVar10 = sv(L"unexpected indent.",0x12);
      f_throw(this,bVar10);
    }
  }
  bVar10 = sv(L"expecting newline.",0x12);
  f_throw(this,bVar10);
}

Assistant:

void t_parser::operator()(ast::t_scope& a_scope)
{
	v_scope = &a_scope;
	size_t indent = v_lexer.f_indent();
	while (v_lexer.f_token() != t_lexer::c_token__EOF) {
		v_scope->v_block.push_back(f_expression());
		if (!v_lexer.f_newline()) f_throw(L"expecting newline."sv);
		if (v_lexer.f_indent() != indent) f_throw(L"unexpected indent."sv);
	}
	for (auto symbol : v_scope->v_unresolveds) {
		auto i = v_scope->v_variables.find(symbol);
		if (i != v_scope->v_variables.end()) i->second.v_shared = true;
	}
	std::vector<t_code::t_variable*> variables;
	variables.swap(v_scope->v_privates);
	if (v_scope->v_self_shared) ++v_scope->v_shareds;
	for (auto p : variables) {
		if (p->v_shared) {
			p->v_index = v_scope->v_shareds++;
		} else {
			p->v_index = v_scope->v_privates.size();
			v_scope->v_privates.push_back(p);
		}
	}
}